

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerExpression.cpp
# Opt level: O1

BaseExpressionPtr __thiscall
Kandinsky::PowerExpression::derivative(PowerExpression *this,VariableExpressionPtr *variable)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *arg2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *arg1;
  shared_ptr<Kandinsky::BaseExpression> sVar2;
  BaseExpressionPtr BVar3;
  Expression local_1c0;
  shared_ptr<Kandinsky::BaseExpression> local_1a8;
  Expression local_198;
  Expression local_180;
  shared_ptr<Kandinsky::BaseExpression> local_168;
  Expression local_158;
  Expression local_140;
  NaturalLogarithmExpression local_128;
  shared_ptr<Kandinsky::BaseExpression> local_110;
  Expression local_100;
  Expression local_e8;
  Expression local_d0;
  Expression local_b8;
  Expression local_a0;
  int local_88 [2];
  shared_ptr<Kandinsky::BaseExpression> local_80;
  PowerExpression local_70;
  PowerExpression local_48;
  
  (*(variable[1].super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_vptr__Sp_counted_base[1])(&local_80);
  local_88[1] = 0;
  operator!=<std::shared_ptr<Kandinsky::BaseExpression>,_int,_nullptr>
            (&local_b8,&local_80,local_88 + 1);
  arg2 = &variable[1].super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  arg1 = &(variable->super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount;
  pow<std::shared_ptr<Kandinsky::BaseExpression>,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_48,(shared_ptr<Kandinsky::BaseExpression> *)arg1,
             (shared_ptr<Kandinsky::BaseExpression> *)arg2);
  (*arg2->_M_pi->_vptr__Sp_counted_base[1])(&local_110);
  log<std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_128,(shared_ptr<Kandinsky::BaseExpression> *)arg1);
  operator*<std::shared_ptr<Kandinsky::BaseExpression>,_Kandinsky::NaturalLogarithmExpression,_nullptr>
            (&local_100,&local_110,&local_128);
  (*arg1->_M_pi->_vptr__Sp_counted_base[1])(&local_168);
  operator*<std::shared_ptr<Kandinsky::BaseExpression>,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_158,(shared_ptr<Kandinsky::BaseExpression> *)arg2,&local_168);
  operator/<Kandinsky::Expression,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_140,&local_158,(shared_ptr<Kandinsky::BaseExpression> *)arg1);
  operator+<Kandinsky::Expression,_Kandinsky::Expression,_nullptr>(&local_e8,&local_100,&local_140);
  operator*<Kandinsky::PowerExpression,_Kandinsky::Expression,_nullptr>
            (&local_d0,&local_48,&local_e8);
  (*arg1->_M_pi->_vptr__Sp_counted_base[1])(&local_1a8);
  operator*<std::shared_ptr<Kandinsky::BaseExpression>,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_198,(shared_ptr<Kandinsky::BaseExpression> *)arg2,&local_1a8);
  local_88[0] = 1;
  operator-<std::shared_ptr<Kandinsky::BaseExpression>,_int,_nullptr>
            (&local_1c0,(shared_ptr<Kandinsky::BaseExpression> *)arg2,local_88);
  pow<std::shared_ptr<Kandinsky::BaseExpression>,_Kandinsky::Expression,_nullptr>
            (&local_70,(shared_ptr<Kandinsky::BaseExpression> *)arg1,&local_1c0);
  operator*<Kandinsky::Expression,_Kandinsky::PowerExpression,_nullptr>
            (&local_180,&local_198,&local_70);
  ifThenElse<Kandinsky::Expression,_Kandinsky::Expression,_Kandinsky::Expression,_nullptr>
            (&local_a0,&local_b8,&local_d0,&local_180);
  sVar2 = BaseExpression::makePtr<Kandinsky::Expression>(&local_a0);
  _Var1 = sVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  local_a0._vptr_Expression = (_func_int **)&PTR_variables_0011c508;
  if (local_a0.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX;
  }
  local_180._vptr_Expression = (_func_int **)&PTR_variables_0011c508;
  if (local_180.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_180.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  local_70.super_BinaryExpression.super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR___cxa_pure_virtual_0011c298;
  if (local_70.super_BinaryExpression.m_arg2.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super_BinaryExpression.m_arg2.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  if (local_70.super_BinaryExpression.m_arg1.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super_BinaryExpression.m_arg1.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_02;
  }
  local_1c0._vptr_Expression = (_func_int **)&PTR_variables_0011c508;
  if (local_1c0.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c0.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_03;
  }
  local_198._vptr_Expression = (_func_int **)&PTR_variables_0011c508;
  if (local_198.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_04;
  }
  if (local_1a8.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a8.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_05;
  }
  local_d0._vptr_Expression = (_func_int **)&PTR_variables_0011c508;
  if (local_d0.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_06;
  }
  local_e8._vptr_Expression = (_func_int **)&PTR_variables_0011c508;
  if (local_e8.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_07;
  }
  local_140._vptr_Expression = (_func_int **)&PTR_variables_0011c508;
  if (local_140.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_08;
  }
  local_158._vptr_Expression = (_func_int **)&PTR_variables_0011c508;
  if (local_158.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_09;
  }
  if (local_168.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_10;
  }
  local_100._vptr_Expression = (_func_int **)&PTR_variables_0011c508;
  if (local_100.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_11;
  }
  local_128.super_UnaryExpression.super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR___cxa_pure_virtual_0011c5e0;
  if (local_128.super_UnaryExpression.m_arg.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.super_UnaryExpression.m_arg.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_12;
  }
  if (local_110.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_13;
  }
  local_48.super_BinaryExpression.super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR___cxa_pure_virtual_0011c298;
  if (local_48.super_BinaryExpression.m_arg2.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super_BinaryExpression.m_arg2.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_14;
  }
  if (local_48.super_BinaryExpression.m_arg1.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super_BinaryExpression.m_arg1.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_15;
  }
  local_b8._vptr_Expression = (_func_int **)&PTR_variables_0011c508;
  if (local_b8.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_16;
  }
  if (local_80.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_17;
  }
  BVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var1._M_pi;
  BVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (BaseExpressionPtr)
         BVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr PowerExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(ifThenElse(m_arg2->derivative(variable) != 0,
                pow(m_arg1, m_arg2) * (
                m_arg2->derivative(variable) * log(m_arg1) +
                m_arg2 * m_arg1->derivative(variable) / m_arg1),
                m_arg2 * m_arg1->derivative(variable) * pow(m_arg1, m_arg2 - 1)));
    }